

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O2

string * __thiscall
duckdb::CSVSchema::GetPath_abi_cxx11_(string *__return_storage_ptr__,CSVSchema *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->file_path);
  return __return_storage_ptr__;
}

Assistant:

string CSVSchema::GetPath() const {
	return file_path;
}